

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

Abc_Ntk_t * Abc_SclBufferPhase(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint Entry;
  Vec_Int_t *pVVar4;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  Abc_Obj_t *pAVar5;
  Abc_Ntk_t *pAVar6;
  int local_58;
  int local_54;
  int Total;
  int Counter2;
  int Counter;
  int k;
  int i;
  int nNodesOld;
  Abc_Obj_t *pFaninNew;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Int_t *vInvs;
  Abc_Ntk_t *pNtkNew;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Total = 0;
  local_54 = 0;
  local_58 = 0;
  if (pNtk->vPhases == (Vec_Int_t *)0x0) {
    __assert_fail("pNtk->vPhases != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclBuffer.c"
                  ,0xcd,"Abc_Ntk_t *Abc_SclBufferPhase(Abc_Ntk_t *, int)");
  }
  iVar2 = Abc_NtkObjNumMax(pNtk);
  pVVar4 = Vec_IntStart(iVar2);
  for (Counter = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), Counter < iVar2; Counter = Counter + 1) {
    pObj_00 = Abc_NtkObj(pNtk,Counter);
    if ((pObj_00 != (Abc_Obj_t *)0x0) &&
       ((iVar2 = Abc_ObjIsNode(pObj_00), iVar2 != 0 || (iVar2 = Abc_ObjIsCo(pObj_00), iVar2 != 0))))
    {
      if (iVar1 <= Counter) break;
      for (Counter2 = 0; iVar2 = Abc_ObjFaninNum(pObj_00), Counter2 < iVar2; Counter2 = Counter2 + 1
          ) {
        pObj_01 = Abc_ObjFanin(pObj_00,Counter2);
        local_58 = local_58 + 1;
        iVar2 = Abc_ObjFaninPhase(pObj_00,Counter2);
        if (iVar2 != 0) {
          uVar3 = Abc_ObjId(pObj_01);
          iVar2 = Vec_IntEntry(pVVar4,uVar3);
          if ((iVar2 == 0) || (iVar2 = Abc_ObjIsCi(pObj_01), iVar2 != 0)) {
            pAVar5 = Abc_NtkCreateNodeInv(pNtk,pObj_01);
            uVar3 = Abc_ObjId(pObj_01);
            Entry = Abc_ObjId(pAVar5);
            Vec_IntWriteEntry(pVVar4,uVar3,Entry);
            Total = Total + 1;
          }
          uVar3 = Abc_ObjId(pObj_01);
          iVar2 = Vec_IntEntry(pVVar4,uVar3);
          pAVar5 = Abc_NtkObj(pNtk,iVar2);
          Abc_ObjPatchFanin(pObj_00,pObj_01,pAVar5);
          local_54 = local_54 + 1;
        }
      }
    }
  }
  if (fVerbose != 0) {
    printf("Added %d inverters (%.2f %% fanins) (%.2f %% compl fanins).\n",
           ((double)Total * 100.0) / (double)local_58,((double)local_54 * 100.0) / (double)local_58,
           (ulong)(uint)Total);
  }
  Vec_IntFree(pVVar4);
  pVVar4 = pNtk->vPhases;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_IntFillExtra(pVVar4,iVar1,0);
  pVVar4 = pNtk->vPhases;
  pNtk->vPhases = (Vec_Int_t *)0x0;
  pAVar6 = Abc_NtkDupDfs(pNtk);
  pNtk->vPhases = pVVar4;
  return pAVar6;
}

Assistant:

Abc_Ntk_t * Abc_SclBufferPhase( Abc_Ntk_t * pNtk, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Int_t * vInvs;
    Abc_Obj_t * pObj, * pFanin, * pFaninNew;
    int nNodesOld = Abc_NtkObjNumMax(pNtk);
    int i, k, Counter = 0, Counter2 = 0, Total = 0;
    assert( pNtk->vPhases != NULL );
    vInvs = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        if ( i >= nNodesOld )
            break;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            Total++;
            if ( !Abc_ObjFaninPhase(pObj, k) )
                continue;
            if ( Vec_IntEntry(vInvs, Abc_ObjId(pFanin)) == 0 || Abc_ObjIsCi(pFanin) ) // allow PIs to have high fanout - to be fixed later
            {
                pFaninNew = Abc_NtkCreateNodeInv( pNtk, pFanin );
                Vec_IntWriteEntry( vInvs, Abc_ObjId(pFanin), Abc_ObjId(pFaninNew) );
                Counter++;
            }
            pFaninNew = Abc_NtkObj( pNtk, Vec_IntEntry(vInvs, Abc_ObjId(pFanin)) );
            Abc_ObjPatchFanin( pObj, pFanin, pFaninNew );
            Counter2++;
        }
    }
    if ( fVerbose )
        printf( "Added %d inverters (%.2f %% fanins) (%.2f %% compl fanins).\n", 
            Counter, 100.0 * Counter / Total, 100.0 * Counter2 / Total );
    Vec_IntFree( vInvs );
    Vec_IntFillExtra( pNtk->vPhases, Abc_NtkObjNumMax(pNtk), 0 );
    // duplicate network in topo order
    vInvs = pNtk->vPhases;
    pNtk->vPhases = NULL;
    pNtkNew = Abc_NtkDupDfs( pNtk );
    pNtk->vPhases = vInvs;
    return pNtkNew;
}